

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_pool.cpp
# Opt level: O3

void ThreadPool::_workerThread(ThreadPool *pool,size_t threadId)

{
  atomic<unsigned_long> *paVar1;
  mutex *__mutex;
  size_t *psVar2;
  __int_type _Var3;
  _List_node_base *p_Var4;
  int iVar5;
  unique_lock<std::mutex> _mutexLock;
  unique_lock<std::mutex> local_50;
  _List_node_base *local_40;
  AbstractTaskProvider *local_38;
  
  LOCK();
  paVar1 = &pool->_runningThreadCount;
  _Var3 = (paVar1->super___atomic_base<unsigned_long>)._M_i;
  (paVar1->super___atomic_base<unsigned_long>)._M_i =
       (paVar1->super___atomic_base<unsigned_long>)._M_i + 1;
  UNLOCK();
  if (_Var3 + 1 == pool->_threadCount) {
    iVar5 = pthread_mutex_lock((pthread_mutex_t *)&pool->_creation);
    if (iVar5 != 0) {
      std::__throw_system_error(iVar5);
    }
    pool->_threadsCreated = true;
    std::condition_variable::notify_one();
    pthread_mutex_unlock((pthread_mutex_t *)&pool->_creation);
  }
  if ((pool->_exit).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start[threadId] == '\0') {
    local_40 = (_List_node_base *)&pool->_task;
    __mutex = &pool->_taskInfo;
    do {
      local_50._M_owns = false;
      local_50._M_device = __mutex;
      std::unique_lock<std::mutex>::lock(&local_50);
      local_50._M_owns = true;
      while ((pool->_run).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start[threadId] == '\0') {
        std::condition_variable::wait((unique_lock *)&pool->_waiting);
      }
      std::unique_lock<std::mutex>::unlock(&local_50);
      if ((pool->_exit).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start[threadId] != '\0') {
        std::unique_lock<std::mutex>::~unique_lock(&local_50);
        break;
      }
      iVar5 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
      if (iVar5 != 0) {
        std::__throw_system_error(iVar5);
      }
      p_Var4 = (((_List_base<AbstractTaskProvider_*,_std::allocator<AbstractTaskProvider_*>_> *)
                &local_40->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
      if (p_Var4 == local_40) {
        (pool->_run).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start[threadId] = '\0';
        pthread_mutex_unlock((pthread_mutex_t *)__mutex);
      }
      else {
        local_38 = (AbstractTaskProvider *)p_Var4[1]._M_next;
        psVar2 = &(pool->_task).
                  super__List_base<AbstractTaskProvider_*,_std::allocator<AbstractTaskProvider_*>_>.
                  _M_impl._M_node._M_size;
        *psVar2 = *psVar2 - 1;
        std::__detail::_List_node_base::_M_unhook();
        operator_delete(p_Var4);
        pthread_mutex_unlock((pthread_mutex_t *)__mutex);
        AbstractTaskProvider::_taskRun(local_38,false);
      }
      std::unique_lock<std::mutex>::~unique_lock(&local_50);
    } while ((pool->_exit).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
             .super__Vector_impl_data._M_start[threadId] == '\0');
  }
  LOCK();
  (pool->_runningThreadCount).super___atomic_base<unsigned_long>._M_i =
       (pool->_runningThreadCount).super___atomic_base<unsigned_long>._M_i - 1;
  UNLOCK();
  return;
}

Assistant:

void ThreadPool::_workerThread( ThreadPool * pool, size_t threadId )
{
    if( ++(pool->_runningThreadCount) == pool->_threadCount ) {
        pool->_creation.lock();
        pool->_threadsCreated = true;
        pool->_completeCreation.notify_one();
        pool->_creation.unlock();
    }

    while( !pool->_exit[threadId] ) {
        std::unique_lock < std::mutex > _mutexLock( pool->_taskInfo );
        pool->_waiting.wait( _mutexLock, [&] { return pool->_run[threadId]; } );
        _mutexLock.unlock();

        if( pool->_exit[threadId] )
            break;

        pool->_taskInfo.lock();

        if( !pool->_task.empty() ) {
            AbstractTaskProvider * task = pool->_task.front();

            pool->_task.pop_front();

            pool->_taskInfo.unlock();

            task->_taskRun( false );
        }
        else {
            pool->_run[threadId] = 0;

            pool->_taskInfo.unlock();
        }
    }

    --(pool->_runningThreadCount);
}